

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O0

void af_cjk_hint_edges(AF_GlyphHints hints,AF_Dimension dim)

{
  AF_Edge_conflict pAVar1;
  bool bVar2;
  AF_Edge_conflict pAVar3;
  long lVar4;
  long lVar5;
  AF_Edge_conflict pAVar6;
  AF_Edge_conflict base;
  FT_Long FVar7;
  AF_Edge_conflict local_c0;
  AF_Edge_conflict after;
  AF_Edge_conflict before;
  FT_Pos span;
  FT_Pos dist2;
  FT_Pos dist1;
  AF_Edge_conflict edge3;
  AF_Edge_conflict edge2_2;
  AF_Edge_conflict edge1_1;
  AF_Edge_conflict edge2_1;
  AF_Edge_conflict edge2;
  AF_Edge_conflict edge1;
  AF_Width blue;
  FT_Pos last_stem_pos;
  FT_Bool has_last_stem;
  FT_Pos FStack_50;
  FT_Int skipped;
  FT_Pos delta;
  AF_Edge_conflict anchor;
  AF_Edge_conflict edge;
  FT_PtrDist n_edges;
  AF_Edge_conflict edge_limit;
  AF_Edge_conflict edges;
  AF_AxisHints axis;
  AF_Dimension dim_local;
  AF_GlyphHints hints_local;
  
  pAVar1 = hints->axis[dim].edges;
  pAVar3 = pAVar1 + hints->axis[dim].num_edges;
  delta = 0;
  FStack_50 = 0;
  last_stem_pos._4_4_ = 0;
  bVar2 = false;
  blue = (AF_Width)0x0;
  for (anchor = pAVar1; pAVar6 = pAVar1, anchor < pAVar3; anchor = anchor + 1) {
    if ((anchor->flags & 4) == 0) {
      edge1 = (AF_Edge_conflict)anchor->blue_edge;
      edge2 = (AF_Edge_conflict)0x0;
      pAVar6 = anchor->link;
      edge2_1 = pAVar6;
      if (edge1 == (AF_Edge_conflict)0x0) {
        if ((pAVar6 != (AF_Edge_conflict)0x0) && (pAVar6->blue_edge != (AF_Width)0x0)) {
          edge1 = (AF_Edge_conflict)pAVar6->blue_edge;
          edge2_1 = anchor;
          edge2 = pAVar6;
        }
      }
      else {
        edge2 = anchor;
      }
      if (edge2 != (AF_Edge_conflict)0x0) {
        edge2->pos = edge1->pos;
        edge2->flags = edge2->flags | 4;
        if ((edge2_1 != (AF_Edge_conflict)0x0) && (edge2_1->blue_edge == (AF_Width)0x0)) {
          af_cjk_align_linked_edge(hints,dim,edge2,edge2_1);
          edge2_1->flags = edge2_1->flags | 4;
        }
        if (delta == 0) {
          delta = (FT_Pos)anchor;
        }
      }
    }
  }
  while (anchor = pAVar6, anchor < pAVar3) {
    if ((anchor->flags & 4) == 0) {
      pAVar6 = anchor->link;
      if (pAVar6 == (AF_Edge_conflict)0x0) {
        last_stem_pos._4_4_ = last_stem_pos._4_4_ + 1;
      }
      else if ((bVar2) && ((anchor->pos < (long)&blue[2].fit || (pAVar6->pos < (long)&blue[2].fit)))
              ) {
        last_stem_pos._4_4_ = last_stem_pos._4_4_ + 1;
      }
      else if (pAVar6->blue_edge == (AF_Width)0x0) {
        if (pAVar6 < anchor) {
          af_cjk_align_linked_edge(hints,dim,pAVar6,anchor);
          anchor->flags = anchor->flags | 4;
          bVar2 = true;
          blue = (AF_Width)anchor->pos;
        }
        else {
          if ((dim == AF_DIMENSION_VERT) || (delta != 0)) {
            af_hint_normal_stem(hints,anchor,pAVar6,FStack_50,dim);
          }
          else {
            FStack_50 = af_hint_normal_stem(hints,anchor,pAVar6,0,AF_DIMENSION_HORZ);
          }
          delta = (FT_Pos)anchor;
          anchor->flags = anchor->flags | 4;
          pAVar6->flags = pAVar6->flags | 4;
          bVar2 = true;
          blue = (AF_Width)pAVar6->pos;
        }
      }
      else {
        af_cjk_align_linked_edge(hints,dim,pAVar6,anchor);
        anchor->flags = anchor->flags | 4;
      }
    }
    pAVar6 = anchor + 1;
  }
  lVar4 = ((long)pAVar3 - (long)pAVar1) / 0x58;
  if ((dim == AF_DIMENSION_HORZ) && ((lVar4 == 6 || (lVar4 == 0xc)))) {
    if (lVar4 == 6) {
      edge3 = pAVar1 + 2;
      dist1 = (FT_Pos)(pAVar1 + 4);
      edge2_2 = pAVar1;
    }
    else {
      edge2_2 = pAVar1 + 1;
      edge3 = pAVar1 + 5;
      dist1 = (FT_Pos)(pAVar1 + 9);
    }
    before = (AF_Edge_conflict)
             ((edge3->opos - edge2_2->opos) - (*(long *)(dist1 + 8) - edge3->opos));
    if ((long)before < 0) {
      before = (AF_Edge_conflict)-(long)before;
    }
    if ((((edge2_2->link == edge2_2 + 1) && (edge3->link == edge3 + 1)) &&
        (*(long *)(dist1 + 0x30) == dist1 + 0x58)) && ((long)before < 8)) {
      lVar5 = *(long *)(dist1 + 0x10) - (edge3->pos * 2 - edge2_2->pos);
      *(long *)(dist1 + 0x10) = *(long *)(dist1 + 0x10) - lVar5;
      if (*(long *)(dist1 + 0x30) != 0) {
        *(long *)(*(long *)(dist1 + 0x30) + 0x10) =
             *(long *)(*(long *)(dist1 + 0x30) + 0x10) - lVar5;
      }
      if (lVar4 == 0xc) {
        pAVar1[8].pos = pAVar1[8].pos - lVar5;
        pAVar1[0xb].pos = pAVar1[0xb].pos - lVar5;
      }
      *(byte *)(dist1 + 0x18) = *(byte *)(dist1 + 0x18) | 4;
      if (*(long *)(dist1 + 0x30) != 0) {
        *(byte *)(*(long *)(dist1 + 0x30) + 0x18) = *(byte *)(*(long *)(dist1 + 0x30) + 0x18) | 4;
      }
    }
  }
  anchor = pAVar1;
  if (last_stem_pos._4_4_ != 0) {
    for (; anchor < pAVar3; anchor = anchor + 1) {
      if (((anchor->flags & 4) == 0) && (anchor->serif != (AF_Edge)0x0)) {
        af_cjk_align_serif_edge(hints,anchor->serif,anchor);
        anchor->flags = anchor->flags | 4;
        last_stem_pos._4_4_ = last_stem_pos._4_4_ + -1;
      }
    }
    anchor = pAVar1;
    if (last_stem_pos._4_4_ != 0) {
      for (; anchor < pAVar3; anchor = anchor + 1) {
        if ((anchor->flags & 4) == 0) {
          local_c0 = anchor;
          after = anchor;
          pAVar6 = after;
          do {
            after = pAVar6;
            pAVar6 = after + -1;
            base = local_c0;
            if (pAVar6 < pAVar1) break;
          } while ((after[-1].flags & 4) == 0);
          do {
            local_c0 = base;
            base = local_c0 + 1;
            if (pAVar3 <= base) break;
          } while ((local_c0[1].flags & 4) == 0);
          if ((pAVar1 <= pAVar6) || (base < pAVar3)) {
            if (pAVar6 < pAVar1) {
              af_cjk_align_serif_edge(hints,base,anchor);
            }
            else if (base < pAVar3) {
              if (base->fpos == pAVar6->fpos) {
                anchor->pos = after[-1].pos;
              }
              else {
                lVar4 = after[-1].pos;
                FVar7 = FT_MulDiv((long)((int)anchor->fpos - (int)pAVar6->fpos),
                                  local_c0[1].pos - after[-1].pos,
                                  (long)((int)base->fpos - (int)pAVar6->fpos));
                anchor->pos = lVar4 + FVar7;
              }
            }
            else {
              af_cjk_align_serif_edge(hints,pAVar6,anchor);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
  af_cjk_hint_edges( AF_GlyphHints  hints,
                     AF_Dimension   dim )
  {
    AF_AxisHints  axis       = &hints->axis[dim];
    AF_Edge       edges      = axis->edges;
    AF_Edge       edge_limit = edges + axis->num_edges;
    FT_PtrDist    n_edges;
    AF_Edge       edge;
    AF_Edge       anchor   = NULL;
    FT_Pos        delta    = 0;
    FT_Int        skipped  = 0;
    FT_Bool       has_last_stem = FALSE;
    FT_Pos        last_stem_pos = 0;

#ifdef FT_DEBUG_LEVEL_TRACE
    FT_UInt       num_actions = 0;
#endif


    FT_TRACE5(( "cjk %s edge hinting (style `%s')\n",
                dim == AF_DIMENSION_VERT ? "horizontal" : "vertical",
                af_style_names[hints->metrics->style_class->style] ));

    /* we begin by aligning all stems relative to the blue zone */

    if ( AF_HINTS_DO_BLUES( hints ) )
    {
      for ( edge = edges; edge < edge_limit; edge++ )
      {
        AF_Width  blue;
        AF_Edge   edge1, edge2;


        if ( edge->flags & AF_EDGE_DONE )
          continue;

        blue  = edge->blue_edge;
        edge1 = NULL;
        edge2 = edge->link;

        if ( blue )
        {
          edge1 = edge;
        }
        else if ( edge2 && edge2->blue_edge )
        {
          blue  = edge2->blue_edge;
          edge1 = edge2;
          edge2 = edge;
        }

        if ( !edge1 )
          continue;

#ifdef FT_DEBUG_LEVEL_TRACE
        FT_TRACE5(( "  CJKBLUE: edge %d @%d (opos=%.2f) snapped to %.2f,"
                    " was %.2f\n",
                    edge1 - edges, edge1->fpos, edge1->opos / 64.0,
                    blue->fit / 64.0, edge1->pos / 64.0 ));

        num_actions++;
#endif

        edge1->pos    = blue->fit;
        edge1->flags |= AF_EDGE_DONE;

        if ( edge2 && !edge2->blue_edge )
        {
          af_cjk_align_linked_edge( hints, dim, edge1, edge2 );
          edge2->flags |= AF_EDGE_DONE;

#ifdef FT_DEBUG_LEVEL_TRACE
          num_actions++;
#endif
        }

        if ( !anchor )
          anchor = edge;
      }
    }

    /* now we align all stem edges. */
    for ( edge = edges; edge < edge_limit; edge++ )
    {
      AF_Edge  edge2;


      if ( edge->flags & AF_EDGE_DONE )
        continue;

      /* skip all non-stem edges */
      edge2 = edge->link;
      if ( !edge2 )
      {
        skipped++;
        continue;
      }

      /* Some CJK characters have so many stems that
       * the hinter is likely to merge two adjacent ones.
       * To solve this problem, if either edge of a stem
       * is too close to the previous one, we avoid
       * aligning the two edges, but rather interpolate
       * their locations at the end of this function in
       * order to preserve the space between the stems.
       */
      if ( has_last_stem                       &&
           ( edge->pos  < last_stem_pos + 64 ||
             edge2->pos < last_stem_pos + 64 ) )
      {
        skipped++;
        continue;
      }

      /* now align the stem */

      /* this should not happen, but it's better to be safe */
      if ( edge2->blue_edge )
      {
        FT_TRACE5(( "ASSERTION FAILED for edge %d\n", edge2-edges ));

        af_cjk_align_linked_edge( hints, dim, edge2, edge );
        edge->flags |= AF_EDGE_DONE;

#ifdef FT_DEBUG_LEVEL_TRACE
        num_actions++;
#endif

        continue;
      }

      if ( edge2 < edge )
      {
        af_cjk_align_linked_edge( hints, dim, edge2, edge );
        edge->flags |= AF_EDGE_DONE;

#ifdef FT_DEBUG_LEVEL_TRACE
        num_actions++;
#endif

        /* We rarely reaches here it seems;
         * usually the two edges belonging
         * to one stem are marked as DONE together
         */
        has_last_stem = TRUE;
        last_stem_pos = edge->pos;
        continue;
      }

      if ( dim != AF_DIMENSION_VERT && !anchor )
      {

#if 0
        if ( fixedpitch )
        {
          AF_Edge     left  = edge;
          AF_Edge     right = edge_limit - 1;
          AF_EdgeRec  left1, left2, right1, right2;
          FT_Pos      target, center1, center2;
          FT_Pos      delta1, delta2, d1, d2;


          while ( right > left && !right->link )
            right--;

          left1  = *left;
          left2  = *left->link;
          right1 = *right->link;
          right2 = *right;

          delta  = ( ( ( hinter->pp2.x + 32 ) & -64 ) - hinter->pp2.x ) / 2;
          target = left->opos + ( right->opos - left->opos ) / 2 + delta - 16;

          delta1  = delta;
          delta1 += af_hint_normal_stem( hints, left, left->link,
                                         delta1, 0 );

          if ( left->link != right )
            af_hint_normal_stem( hints, right->link, right, delta1, 0 );

          center1 = left->pos + ( right->pos - left->pos ) / 2;

          if ( center1 >= target )
            delta2 = delta - 32;
          else
            delta2 = delta + 32;

          delta2 += af_hint_normal_stem( hints, &left1, &left2, delta2, 0 );

          if ( delta1 != delta2 )
          {
            if ( left->link != right )
              af_hint_normal_stem( hints, &right1, &right2, delta2, 0 );

            center2 = left1.pos + ( right2.pos - left1.pos ) / 2;

            d1 = center1 - target;
            d2 = center2 - target;

            if ( FT_ABS( d2 ) < FT_ABS( d1 ) )
            {
              left->pos       = left1.pos;
              left->link->pos = left2.pos;

              if ( left->link != right )
              {
                right->link->pos = right1.pos;
                right->pos       = right2.pos;
              }

              delta1 = delta2;
            }
          }

          delta               = delta1;
          right->link->flags |= AF_EDGE_DONE;
          right->flags       |= AF_EDGE_DONE;
        }
        else

#endif /* 0 */

          delta = af_hint_normal_stem( hints, edge, edge2, 0,
                                       AF_DIMENSION_HORZ );
      }
      else
        af_hint_normal_stem( hints, edge, edge2, delta, dim );

#if 0
      printf( "stem (%d,%d) adjusted (%.1f,%.1f)\n",
               edge - edges, edge2 - edges,
               ( edge->pos - edge->opos ) / 64.0,
               ( edge2->pos - edge2->opos ) / 64.0 );
#endif

      anchor = edge;
      edge->flags  |= AF_EDGE_DONE;
      edge2->flags |= AF_EDGE_DONE;
      has_last_stem = TRUE;
      last_stem_pos = edge2->pos;
    }

    /* make sure that lowercase m's maintain their symmetry */

    /* In general, lowercase m's have six vertical edges if they are sans */
    /* serif, or twelve if they are with serifs.  This implementation is  */
    /* based on that assumption, and seems to work very well with most    */
    /* faces.  However, if for a certain face this assumption is not      */
    /* true, the m is just rendered like before.  In addition, any stem   */
    /* correction will only be applied to symmetrical glyphs (even if the */
    /* glyph is not an m), so the potential for unwanted distortion is    */
    /* relatively low.                                                    */

    /* We don't handle horizontal edges since we can't easily assure that */
    /* the third (lowest) stem aligns with the base line; it might end up */
    /* one pixel higher or lower.                                         */

    n_edges = edge_limit - edges;
    if ( dim == AF_DIMENSION_HORZ && ( n_edges == 6 || n_edges == 12 ) )
    {
      AF_Edge  edge1, edge2, edge3;
      FT_Pos   dist1, dist2, span;


      if ( n_edges == 6 )
      {
        edge1 = edges;
        edge2 = edges + 2;
        edge3 = edges + 4;
      }
      else
      {
        edge1 = edges + 1;
        edge2 = edges + 5;
        edge3 = edges + 9;
      }

      dist1 = edge2->opos - edge1->opos;
      dist2 = edge3->opos - edge2->opos;

      span = dist1 - dist2;
      if ( span < 0 )
        span = -span;

      if ( edge1->link == edge1 + 1 &&
           edge2->link == edge2 + 1 &&
           edge3->link == edge3 + 1 && span < 8 )
      {
        delta = edge3->pos - ( 2 * edge2->pos - edge1->pos );
        edge3->pos -= delta;
        if ( edge3->link )
          edge3->link->pos -= delta;

        /* move the serifs along with the stem */
        if ( n_edges == 12 )
        {
          ( edges + 8 )->pos -= delta;
          ( edges + 11 )->pos -= delta;
        }

        edge3->flags |= AF_EDGE_DONE;
        if ( edge3->link )
          edge3->link->flags |= AF_EDGE_DONE;
      }
    }

    if ( !skipped )
      goto Exit;

    /*
     *  now hint the remaining edges (serifs and single) in order
     *  to complete our processing
     */
    for ( edge = edges; edge < edge_limit; edge++ )
    {
      if ( edge->flags & AF_EDGE_DONE )
        continue;

      if ( edge->serif )
      {
        af_cjk_align_serif_edge( hints, edge->serif, edge );
        edge->flags |= AF_EDGE_DONE;
        skipped--;
      }
    }

    if ( !skipped )
      goto Exit;

    for ( edge = edges; edge < edge_limit; edge++ )
    {
      AF_Edge  before, after;


      if ( edge->flags & AF_EDGE_DONE )
        continue;

      before = after = edge;

      while ( --before >= edges )
        if ( before->flags & AF_EDGE_DONE )
          break;

      while ( ++after < edge_limit )
        if ( after->flags & AF_EDGE_DONE )
          break;

      if ( before >= edges || after < edge_limit )
      {
        if ( before < edges )
          af_cjk_align_serif_edge( hints, after, edge );
        else if ( after >= edge_limit )
          af_cjk_align_serif_edge( hints, before, edge );
        else
        {
          if ( after->fpos == before->fpos )
            edge->pos = before->pos;
          else
            edge->pos = before->pos +
                        FT_MulDiv( edge->fpos - before->fpos,
                                   after->pos - before->pos,
                                   after->fpos - before->fpos );
        }
      }
    }

  Exit:

#ifdef FT_DEBUG_LEVEL_TRACE
    if ( !num_actions )
      FT_TRACE5(( "  (none)\n" ));
    FT_TRACE5(( "\n" ));
#endif

    return;
  }